

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadBoneAssignments(OgreXmlSerializer *this,VertexDataXml *dest)

{
  bool bVar1;
  DeadlyImportError *this_00;
  reference puVar2;
  pointer pVVar3;
  VertexBoneAssignmentList *this_01;
  Logger *this_02;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_03;
  basic_formatter *this_04;
  size_type local_2a8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_128;
  reference local_108;
  VertexBoneAssignment *boneAssign;
  iterator __end4;
  iterator __begin4;
  VertexBoneAssignmentList *__range4;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_e0;
  const_iterator baEnd;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_d0;
  const_iterator baIter;
  float sum;
  uint32_t vertexIndex;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  float epsilon;
  undefined1 local_8c [8];
  VertexBoneAssignment ba;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> influencedVertices;
  allocator<char> local_39;
  string local_38;
  VertexDataXml *local_18;
  VertexDataXml *dest_local;
  OgreXmlSerializer *this_local;
  
  local_18 = dest;
  dest_local = (VertexDataXml *)this;
  if (dest != (VertexDataXml *)0x0) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &ba.boneIndex);
    NextNode_abi_cxx11_(this);
    while (bVar1 = std::operator==(&this->m_currentNodeName,nnVertexBoneAssignment), bVar1) {
      local_8c._0_4_ = ReadAttribute<unsigned_int>(this,ReadBoneAssignments::anVertexIndex);
      local_8c._4_2_ = ReadAttribute<unsigned_short>(this,ReadBoneAssignments::anBoneIndex);
      ba.vertexIndex = (uint32_t)ReadAttribute<float>(this,ReadBoneAssignments::anWeight);
      std::
      vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
      ::push_back(&(local_18->super_IVertexData).boneAssignments,(value_type *)local_8c);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &ba.boneIndex,(value_type_conflict1 *)local_8c);
      NextNode_abi_cxx11_(this);
    }
    __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&ba.boneIndex);
    _sum = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &ba.boneIndex);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&sum), bVar1) {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
      baIter._M_current._4_4_ = *puVar2;
      baIter._M_current._0_4_ = 0.0;
      baEnd._M_current =
           (VertexBoneAssignment *)
           std::
           vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
           ::begin(&(local_18->super_IVertexData).boneAssignments);
      __gnu_cxx::
      __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
      ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
                ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                  *)&local_d0,
                 (__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                  *)&baEnd);
      __range4 = (VertexBoneAssignmentList *)
                 std::
                 vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                 ::end(&(local_18->super_IVertexData).boneAssignments);
      __gnu_cxx::
      __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
      ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
                ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                  *)&local_e0,
                 (__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                  *)&__range4);
      while (bVar1 = __gnu_cxx::operator!=(&local_d0,&local_e0), bVar1) {
        pVVar3 = __gnu_cxx::
                 __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                 ::operator->(&local_d0);
        if (pVVar3->vertexIndex == baIter._M_current._4_4_) {
          pVVar3 = __gnu_cxx::
                   __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                   ::operator->(&local_d0);
          baIter._M_current._0_4_ = pVVar3->weight + baIter._M_current._0_4_;
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
        ::operator++(&local_d0);
      }
      if ((baIter._M_current._0_4_ < 0.95) || (1.05 < baIter._M_current._0_4_)) {
        this_01 = &(local_18->super_IVertexData).boneAssignments;
        __end4 = std::
                 vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                 ::begin(this_01);
        boneAssign = (VertexBoneAssignment *)
                     std::
                     vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                     ::end(this_01);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                                           *)&boneAssign), bVar1) {
          local_108 = __gnu_cxx::
                      __normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                      ::operator*(&__end4);
          if (local_108->vertexIndex == baIter._M_current._4_4_) {
            local_108->weight = local_108->weight / baIter._M_current._0_4_;
          }
          __gnu_cxx::
          __normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
          ::operator++(&__end4);
        }
      }
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
    }
    this_02 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>(&local_2a0,(char (*) [5])"  - ");
    local_2a8 = std::
                vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                ::size(&(local_18->super_IVertexData).boneAssignments);
    this_03 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_2a0,&local_2a8);
    this_04 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(this_03,(char (*) [18])" bone assignments");
    Formatter::basic_formatter::operator_cast_to_string(&local_128,this_04);
    Logger::debug(this_02,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_2a0);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &ba.boneIndex);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Cannot read bone assignments, vertex data is null.",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void OgreXmlSerializer::ReadBoneAssignments(VertexDataXml *dest)
{
    if (!dest) {
        throw DeadlyImportError("Cannot read bone assignments, vertex data is null.");
    }

    static const char *anVertexIndex = "vertexindex";
    static const char *anBoneIndex   = "boneindex";
    static const char *anWeight      = "weight";

    std::set<uint32_t> influencedVertices;

    NextNode();
    while(m_currentNodeName == nnVertexBoneAssignment)
    {
        VertexBoneAssignment ba;
        ba.vertexIndex = ReadAttribute<uint32_t>(anVertexIndex);
        ba.boneIndex = ReadAttribute<uint16_t>(anBoneIndex);
        ba.weight = ReadAttribute<float>(anWeight);

        dest->boneAssignments.push_back(ba);
        influencedVertices.insert(ba.vertexIndex);

        NextNode();
    }

    /** Normalize bone weights.
        Some exporters won't care if the sum of all bone weights
        for a single vertex equals 1 or not, so validate here. */
    const float epsilon = 0.05f;
    for (const uint32_t vertexIndex : influencedVertices)
    {
        float sum = 0.0f;
        for (VertexBoneAssignmentList::const_iterator baIter=dest->boneAssignments.begin(), baEnd=dest->boneAssignments.end(); baIter != baEnd; ++baIter)
        {
            if (baIter->vertexIndex == vertexIndex)
                sum += baIter->weight;
        }
        if ((sum < (1.0f - epsilon)) || (sum > (1.0f + epsilon)))
        {
            for (auto &boneAssign : dest->boneAssignments)
            {
                if (boneAssign.vertexIndex == vertexIndex)
                    boneAssign.weight /= sum;
            }
        }
    }

    ASSIMP_LOG_DEBUG_F( "  - ", dest->boneAssignments.size(), " bone assignments");
}